

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

ID_index __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
::get_pivot(Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
            *this)

{
  ID_index IVar1;
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
  *this_local;
  
  IVar1 = Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
          ::get_pivot(&this->super_Chain_column_option);
  return IVar1;
}

Assistant:

inline typename Naive_vector_column<Master_matrix,Support>::ID_index Naive_vector_column<Master_matrix,Support>::get_pivot() const
{
  static_assert(Master_matrix::isNonBasic,
                "Method not available for base columns.");  // could technically be, but is the notion useful then?

  if constexpr (Master_matrix::Option_list::is_of_boundary_type) {
    return column_.empty() ? Master_matrix::template get_null_value<ID_index>() : column_.back()->get_row_index();
  } else {
    return Chain_opt::get_pivot();
  }
}